

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O0

int FastPForLib::FastPForTest_fastpack_4_noexcept_Test::AddToRegistry(void)

{
  ParameterizedTestSuiteInfo<FastPForLib::FastPForTest> *a_file;
  TestMetaFactory<FastPForLib::FastPForTest_fastpack_4_noexcept_Test> *this;
  undefined8 in_stack_ffffffffffffff00;
  int iVar1;
  string *in_stack_ffffffffffffff08;
  CodeLocation *this_00;
  allocator<char> local_d1;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  CodeLocation *in_stack_ffffffffffffff70;
  TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  CodeLocation *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  ParameterizedTestSuiteRegistry *in_stack_ffffffffffffffe0;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  testing::UnitTest::GetInstance();
  testing::UnitTest::parameterized_test_registry((UnitTest *)0x12ae14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  this_00 = (CodeLocation *)&stack0xffffffffffffff7f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  testing::internal::CodeLocation::CodeLocation(this_00,in_stack_ffffffffffffff08,iVar1);
  a_file = testing::internal::ParameterizedTestSuiteRegistry::
           GetTestSuitePatternHolder<FastPForLib::FastPForTest>
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)
  ;
  this = (TestMetaFactory<FastPForLib::FastPForTest_fastpack_4_noexcept_Test> *)operator_new(8);
  (this->
  super_TestMetaFactoryBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_TestMetaFactoryBase = (_func_int **)0x0;
  testing::internal::TestMetaFactory<FastPForLib::FastPForTest_fastpack_4_noexcept_Test>::
  TestMetaFactory(this);
  iVar1 = (int)((ulong)this >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  testing::internal::CodeLocation::CodeLocation(this_00,(string *)a_file,iVar1);
  testing::internal::ParameterizedTestSuiteInfo<FastPForLib::FastPForTest>::AddTestPattern
            ((ParameterizedTestSuiteInfo<FastPForLib::FastPForTest> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70);
  testing::internal::CodeLocation::~CodeLocation((CodeLocation *)0x12af3b);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  std::allocator<char>::~allocator(&local_d1);
  testing::internal::CodeLocation::~CodeLocation((CodeLocation *)0x12af5c);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdf);
  return 0;
}

Assistant:

TEST_P(FastPForTest, fastpack_4_noexcept) {
    _genDataWithFixBits(in32, 4, 1024);
    _verify();
    _copy64();
    _verify64();
  }